

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DP.c
# Opt level: O2

void pnga_copy_patch_dp(char *t_a,Integer g_a,Integer ailo,Integer aihi,Integer ajlo,Integer ajhi,
                       Integer g_b,Integer bilo,Integer bihi,Integer bjlo,Integer bjhi)

{
  DoublePrecision DVar1;
  Integer IVar2;
  Integer IVar3;
  Integer IVar4;
  Integer IVar5;
  logical lVar6;
  long lVar7;
  DoublePrecision *pDVar8;
  long lVar9;
  long lVar10;
  DoublePrecision *pDVar11;
  long lVar12;
  long lVar13;
  DoublePrecision *dbl_ptrA;
  Integer local_c8;
  DoublePrecision *local_c0;
  Integer ld;
  Integer local_b0;
  Integer hi [2];
  Integer lo [2];
  Integer jhis;
  Integer jlos;
  Integer ihis;
  Integer ilos;
  Integer btype;
  Integer ndim;
  Integer atype;
  Integer dims [2];
  
  local_c0 = (DoublePrecision *)t_a;
  local_c8 = pnga_nodeid();
  dbl_ptrA = (DoublePrecision *)0x0;
  pnga_check_handle(g_a,"pnga_copy_patch_dp");
  pnga_check_handle(g_b,"pnga_copy_patch_dp");
  local_b0 = g_a;
  pnga_inquire(g_a,&atype,&ndim,dims);
  IVar3 = dims[1];
  IVar2 = dims[0];
  pnga_inquire(g_b,&btype,&ndim,dims);
  if ((atype != 0x3ec) || (btype != 0x3ec)) {
    pnga_error("pnga_copy_patch_dp: wrong types ",0);
  }
  if ((((ailo < 1) || (ajlo < 1)) || (IVar2 < aihi)) || (IVar3 < ajhi)) {
    pnga_error(" pnga_copy_patch_dp: g_a indices out of range ",0);
  }
  if (((bilo < 1) || (bjlo < 1)) || ((dims[0] < bihi || (dims[1] < bjhi)))) {
    pnga_error(" pnga_copy_patch_dp: g_b indices out of range ",0);
  }
  if ((bihi - bilo != aihi - ailo) || (bjhi - bjlo != ajhi - ajlo)) {
    pnga_error(" pnga_copy_patch_dp: shapes two of patches do not match ",0);
  }
  IVar2 = local_b0;
  DVar1 = *local_c0;
  pnga_distribution(local_b0,local_c8,lo,hi);
  ilos = lo[0];
  jlos = lo[1];
  ihis = hi[0];
  jhis = hi[1];
  lVar6 = patch_intersect(ailo,aihi,ajlo,ajhi,&ilos,&ihis,&jlos,&jhis);
  if (lVar6 != 0) {
    pnga_access_ptr(IVar2,lo,hi,&dbl_ptrA,&ld);
    IVar5 = ilos;
    IVar4 = ihis;
    IVar3 = jlos;
    IVar2 = jhis;
    if (((ulong)DVar1 & 0xdf) == 0x4e) {
      lo[0] = ilos + (bilo - ailo);
      hi[0] = ihis + (bilo - ailo);
      lo[1] = jlos + (bjlo - ajlo);
      hi[1] = jhis + (bjlo - ajlo);
      pDVar8 = (DoublePrecision *)0x0;
    }
    else {
      lVar9 = ihis - ilos;
      lVar13 = jhis - jlos;
      local_c8 = lVar13 + 1;
      local_c0 = (DoublePrecision *)pnga_malloc((lVar9 + 1) * local_c8,0x3f5,"copypatch_dp");
      lVar7 = 0;
      pDVar8 = local_c0;
      for (lVar10 = 0; lVar10 <= lVar13; lVar10 = lVar10 + 1) {
        pDVar11 = pDVar8;
        for (lVar12 = 0; lVar12 <= lVar9; lVar12 = lVar12 + 1) {
          *pDVar11 = *(DoublePrecision *)((long)dbl_ptrA + lVar12 * 8 + ld * lVar7);
          pDVar11 = pDVar11 + lVar13 + 1;
        }
        lVar7 = lVar7 + 8;
        pDVar8 = pDVar8 + 1;
      }
      pnga_release(local_b0,lo,hi);
      dbl_ptrA = local_c0;
      ld = local_c8;
      lo[0] = IVar3 + (bilo - ajlo);
      hi[0] = IVar2 + (bilo - ajlo);
      lo[1] = IVar5 + (bjlo - ailo);
      hi[1] = IVar4 + (bjlo - ailo);
      pDVar8 = local_c0;
    }
    pnga_put(g_b,lo,hi,dbl_ptrA,&ld);
    if (((ulong)DVar1 & 0xdf) != 0x4e) {
      pnga_free(pDVar8);
    }
  }
  return;
}

Assistant:

void pnga_copy_patch_dp(t_a, g_a, ailo, aihi, ajlo, ajhi,
                   g_b, bilo, bihi, bjlo, bjhi)
     Integer g_a, ailo, aihi, ajlo, ajhi;
     Integer g_b, bilo, bihi, bjlo, bjhi;
     char *t_a;
{
Integer atype, btype, adim1, adim2, bdim1, bdim2;
Integer ilos, ihis, jlos, jhis;
Integer ilod, ihid, jlod, jhid, corr, nelem;
Integer me= pnga_nodeid(), ld, i,j;
Integer lo[2], hi[2];
Integer ldT;
char transp;
DoublePrecision *dbl_ptrA=NULL, *dbl_ptrB=NULL;
Integer ndim, dims[2];

   pnga_check_handle(g_a, "pnga_copy_patch_dp");
   pnga_check_handle(g_b, "pnga_copy_patch_dp");

   /* if(g_a == g_b) pnga_error("pnga_copy_patch_dp: arrays have to different ", 0L); */

   pnga_inquire(g_a, &atype, &ndim, dims);
   adim1 = dims[0];
   adim2 = dims[1];
   pnga_inquire(g_b, &btype, &ndim, dims);
   bdim1 = dims[0];
   bdim2 = dims[1];

   if(atype != btype || (atype != C_DBL ))
      pnga_error("pnga_copy_patch_dp: wrong types ", 0L);

   /* check if patch indices and dims match */
   if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
       pnga_error(" pnga_copy_patch_dp: g_a indices out of range ", 0L);
   if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
       pnga_error(" pnga_copy_patch_dp: g_b indices out of range ", 0L);

   /* check if numbers of elements in two patches match each other */
   if (((bihi - bilo + 1)  != (aihi - ailo + 1)) || 
      ( (bjhi - bjlo + 1)  != (ajhi - ajlo + 1)) )
       pnga_error(" pnga_copy_patch_dp: shapes two of patches do not match ", 0L);

    /* is transpose operation required ? */
   transp = (*t_a == 'n' || *t_a =='N')? 'n' : 't';

   /* now find out cordinates of a patch of g_a that I own */
   pnga_distribution(g_a, me, lo, hi);
   ilos = lo[0];
   jlos = lo[1];
   ihis = hi[0];
   jhis = hi[1];

   if(patch_intersect(ailo, aihi, ajlo, ajhi, &ilos, &ihis, &jlos, &jhis)){
      pnga_access_ptr(g_a, lo, hi, &dbl_ptrA, &ld);
      
      nelem = (ihis-ilos+1)*(jhis-jlos+1);
      
      if ( transp == 'n' ) {
	  corr  = bilo - ailo;
	  ilod  = ilos + corr; 
	  ihid  = ihis + corr;
	  corr  = bjlo - ajlo;
	  jlod  = jlos + corr; 
	  jhid  = jhis + corr;
      } else {
	/* If this is a transpose copy, we need local scratch space */
	dbl_ptrB = (DoublePrecision*) pnga_malloc(nelem,MT_F_DBL,"copypatch_dp");

	  /* Copy from the source into this local array, transposed */
	  ldT = jhis-jlos+1;
	  
	  for(j=0; j< jhis-jlos+1; j++)
	      for(i=0; i< ihis-ilos+1; i++)
		  *(dbl_ptrB + i*ldT + j) = *(dbl_ptrA + j*ld + i);

	  /* Now we can reset index to point to the transposed stuff */
      pnga_release(g_a, lo, hi);
	  dbl_ptrA = dbl_ptrB;
	  ld = ldT;

	  /* And finally, figure out what the destination indices are */
	  corr  = bilo - ajlo;
	  ilod  = jlos + corr; 
	  ihid  = jhis + corr;
	  corr  = bjlo - ailo;
	  jlod  = ilos + corr; 
	  jhid  = ihis + corr;
      }
	  
      /* Put it where it belongs */
      lo[0] = ilod;
      lo[1] = jlod;
      hi[0] = ihid;
      hi[1] = jhid;
      pnga_put(g_b, lo, hi, dbl_ptrA, &ld);

      /* Get rid of local memory if we used it */
      if( transp == 't') pnga_free(dbl_ptrB);
  }
}